

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,char_const*>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1)

{
  longlong lVar1;
  size_t sVar2;
  longlong *in_RDX;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *in_RDI;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_c9;
  char *local_c8;
  size_t local_c0;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  char *local_a8 [4];
  undefined1 *local_88;
  basic_string_view<char> local_80;
  char **local_70;
  basic_string_view<char> local_68 [2];
  size_t local_40;
  
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_88 = &local_c9;
  local_80 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x15585b);
  local_c8 = local_80.data_;
  local_c0 = local_80.size_;
  local_68[0].data_ = local_80.data_;
  local_68[0].size_ = local_80.size_;
  local_70 = local_a8;
  local_a8[0] = basic_string_view<char>::data(local_68);
  sVar2 = basic_string_view<char>::size(local_68);
  lVar1 = *in_RDX;
  (in_RDI->data_).args_[0].field_0.string.data = local_a8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar2;
  (in_RDI->data_).args_[1].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[1].field_0.string.size = local_40;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}